

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  uint uVar1;
  cmCPackLog *pcVar2;
  cmMakefile *this_00;
  cmMakefile *this_01;
  char cVar3;
  _Alloc_hider _Var4;
  undefined1 this_02 [8];
  string *psVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar12;
  char *pcVar13;
  pointer filename_00;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> crypto;
  ostringstream cmCPackLog_msg;
  string hashFile;
  string filename;
  string tmpPF;
  ostringstream cmCPackLog_msg_15;
  string findExpr;
  Glob gl;
  undefined1 auStack_4e8 [15];
  allocator<char> local_4d9;
  string local_4d8;
  undefined1 local_4b8 [8];
  undefined1 local_4b0 [8];
  size_type local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  uint auStack_490 [20];
  ios_base local_440 [136];
  ios_base local_3b8 [264];
  long *local_2b0;
  long local_2a8;
  long local_2a0 [2];
  string local_290;
  string local_270;
  char *local_250;
  char *local_248;
  string *local_240;
  string local_238 [3];
  ios_base local_1c8 [264];
  undefined8 local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  pointer local_b0;
  string local_a8;
  Glob local_88;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b0,"Create package using ",0x15);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_4b0,(this->Name)._M_dataplus._M_p,
                      (this->Name)._M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var4._M_p = local_238[0]._M_dataplus._M_p;
  sVar9 = strlen(local_238[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3bd,_Var4._M_p,sVar9);
  paVar11 = &local_238[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar11) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                             local_238[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base(local_440);
  iVar7 = PrepareNames(this);
  if (iVar7 == 0) {
    return 0;
  }
  iVar7 = (*this->_vptr_cmCPackGenerator[6])(this);
  if (iVar7 == 0) {
    return 0;
  }
  local_4b0 = (undefined1  [8])&local_4a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b0,"CPACK_REMOVE_TOPLEVEL_DIRECTORY","");
  pcVar10 = GetOption(this,(string *)local_4b0);
  bVar6 = cmSystemTools::IsOn(pcVar10);
  if (local_4b0 != (undefined1  [8])&local_4a0) {
    operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
  }
  if (bVar6) {
    local_4b0 = (undefined1  [8])&local_4a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b0,"CPACK_TOPLEVEL_DIRECTORY","");
    pcVar10 = GetOption(this,(string *)local_4b0);
    if (local_4b0 != (undefined1  [8])&local_4a0) {
      operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
    }
    bVar6 = cmsys::SystemTools::FileExists(pcVar10);
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b0,"Remove toplevel directory: ",0x1b);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_4b0 + -0x18) + 0x38);
      }
      else {
        sVar9 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,pcVar10,sVar9);
      }
      std::ios::widen((char)(ostringstream *)local_4b0 +
                      (char)*(undefined8 *)((long)local_4b0 + -0x18));
      std::ostream::put((char)local_4b0);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var4._M_p = local_238[0]._M_dataplus._M_p;
      sVar9 = strlen(local_238[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x3d1,_Var4._M_p,sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar11) {
        operator_delete(local_238[0]._M_dataplus._M_p,
                        CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                 local_238[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
      std::ios_base::~ios_base(local_440);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4b0,pcVar10,(allocator<char> *)local_238);
      bVar6 = cmSystemTools::RepeatedRemoveDirectory((string *)local_4b0);
      if (local_4b0 != (undefined1  [8])&local_4a0) {
        operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
      }
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4b0,"Problem removing toplevel directory: ",0x25);
        if (pcVar10 == (char *)0x0) {
          std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_4b0 + -0x18) + 0x38);
        }
        else {
          sVar9 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,pcVar10,sVar9);
        }
        std::ios::widen((char)(ostringstream *)local_4b0 +
                        (char)*(undefined8 *)((long)local_4b0 + -0x18));
        std::ostream::put((char)local_4b0);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        _Var4._M_p = local_238[0]._M_dataplus._M_p;
        sVar9 = strlen(local_238[0]._M_dataplus._M_p);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x3d5,_Var4._M_p,sVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0]._M_dataplus._M_p != paVar11) {
          operator_delete(local_238[0]._M_dataplus._M_p,
                          CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                   local_238[0].field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
        std::ios_base::~ios_base(local_440);
        return 0;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b0,"About to install project ",0x19);
  std::ios::widen((char)(ostringstream *)local_4b0 + (char)*(undefined8 *)((long)local_4b0 + -0x18))
  ;
  std::ostream::put((char)local_4b0);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var4._M_p = local_238[0]._M_dataplus._M_p;
  sVar9 = strlen(local_238[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3db,_Var4._M_p,sVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar11) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                             local_238[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base(local_440);
  iVar7 = InstallProject(this);
  if (iVar7 == 0) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b0,"Done install project ",0x15);
  std::ios::widen((char)(ostringstream *)local_4b0 + (char)*(undefined8 *)((long)local_4b0 + -0x18))
  ;
  std::ostream::put((char)local_4b0);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var4._M_p = local_238[0]._M_dataplus._M_p;
  sVar9 = strlen(local_238[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3e0,_Var4._M_p,sVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar11) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                             local_238[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base(local_440);
  local_4b0 = (undefined1  [8])&local_4a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b0,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)GetOption(this,(string *)local_4b0);
  if (local_4b0 != (undefined1  [8])&local_4a0) {
    operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
  }
  local_4b0 = (undefined1  [8])&local_4a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b0,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar10 = GetOption(this,(string *)local_4b0);
  if (local_4b0 != (undefined1  [8])&local_4a0) {
    operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"Find files",10);
  std::ios::widen((char)(ostringstream *)local_4b0 + (char)*(undefined8 *)((long)local_4b0 + -0x18))
  ;
  std::ostream::put((char)local_4b0);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var4._M_p = local_238[0]._M_dataplus._M_p;
  sVar9 = strlen(local_238[0]._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3e6,_Var4._M_p,sVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                             local_238[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base(local_440);
  cmsys::Glob::Glob(&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,pcVar10,(allocator<char> *)local_4b0);
  std::__cxx11::string::append((char *)&local_a8);
  local_88.Recurse = true;
  local_88.RecurseListDirs = true;
  local_88.RecurseThroughSymlinks = false;
  bVar6 = cmsys::Glob::FindFiles(&local_88,&local_a8,(GlobMessages *)0x0);
  if (bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"Create package",0xe);
    std::ios::widen((char)(ostream *)local_4b0 + (char)*(undefined8 *)((long)local_4b0 + -0x18));
    std::ostream::put((char)local_4b0);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var4._M_p = local_238[0]._M_dataplus._M_p;
    sVar9 = strlen(local_238[0]._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3f3,_Var4._M_p,sVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,
                      CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                               local_238[0].field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base(local_440);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b0,"Package files to: ",0x12);
    pcVar13 = (char *)paVar11;
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar13 = "(NULL)";
    }
    sVar9 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,pcVar13,sVar9);
    std::ios::widen((char)(ostream *)local_4b0 + (char)*(undefined8 *)((long)local_4b0 + -0x18));
    std::ostream::put((char)local_4b0);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var4._M_p = local_238[0]._M_dataplus._M_p;
    sVar9 = strlen(local_238[0]._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3f7,_Var4._M_p,sVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,
                      CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                               local_238[0].field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base(local_440);
    bVar6 = cmsys::SystemTools::FileExists(paVar11->_M_local_buf);
    if (bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b0,"Remove old package file",0x17);
      std::ios::widen((char)(ostream *)local_4b0 + (char)*(undefined8 *)((long)local_4b0 + -0x18));
      std::ostream::put((char)local_4b0);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var4._M_p = local_238[0]._M_dataplus._M_p;
      sVar9 = strlen(local_238[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x3fa,_Var4._M_p,sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p,
                        CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                 local_238[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
      std::ios_base::~ios_base(local_440);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4b0,paVar11->_M_local_buf,(allocator<char> *)local_238);
      cmsys::SystemTools::RemoveFile((string *)local_4b0);
      if (local_4b0 != (undefined1  [8])&local_4a0) {
        operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
      }
    }
    local_4b0 = (undefined1  [8])&local_4a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b0,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY","");
    pcVar13 = GetOption(this,(string *)local_4b0);
    bVar6 = cmSystemTools::IsOn(pcVar13);
    if (local_4b0 != (undefined1  [8])&local_4a0) {
      operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_4b0 = (undefined1  [8])&local_4a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b0,"CPACK_TOPLEVEL_DIRECTORY","");
      pcVar10 = GetOption(this,(string *)local_4b0);
      if (local_4b0 != (undefined1  [8])&local_4a0) {
        operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
      }
    }
    __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->files,__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->packageFileNames,
                      (this->packageFileNames).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x5792ae;
    }
    local_4b0 = (undefined1  [8])paVar11;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->packageFileNames,(char **)local_4b0);
    pcVar13 = (char *)(this->toplevel)._M_string_length;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace((ulong)&this->toplevel,0,pcVar13,(ulong)pcVar10);
    paVar11 = &local_238[0].field_2;
    this_00 = this->MakefileMap;
    cmMakefile::PushScope(this_00);
    this_01 = this->MakefileMap;
    pcVar10 = cmVersion::GetCMakeVersion();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_4b0,pcVar10,(allocator<char> *)&local_270);
    local_238[0]._M_string_length = 0;
    local_238[0].field_2._M_local_buf[0] = '\0';
    local_238[0]._M_dataplus._M_p = (pointer)paVar11;
    cmMakefile::SetPolicyVersion(this_01,(string *)local_4b0,local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != paVar11) {
      operator_delete(local_238[0]._M_dataplus._M_p,
                      CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                               local_238[0].field_2._M_local_buf[0]) + 1);
    }
    if (local_4b0 != (undefined1  [8])&local_4a0) {
      operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
    }
    iVar7 = (*this->_vptr_cmCPackGenerator[9])(this);
    if ((((iVar7 == 0) || (cmSystemTools::s_ErrorOccured != false)) ||
        (cmSystemTools::s_FatalErrorOccured != false)) ||
       (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b0,"Problem compressing the directory",0x21);
      std::ios::widen((char)(ostream *)local_4b0 + (char)*(undefined8 *)((long)local_4b0 + -0x18));
      std::ostream::put((char)local_4b0);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var4._M_p = local_238[0]._M_dataplus._M_p;
      sVar9 = strlen(local_238[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x416,_Var4._M_p,sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar11) {
        operator_delete(local_238[0]._M_dataplus._M_p,
                        CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                 local_238[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
      std::ios_base::~ios_base(local_440);
      iVar7 = 0;
      cmMakefile::PopScope(this_00);
    }
    else {
      cmMakefile::PopScope(this_00);
      local_4b0 = (undefined1  [8])&local_4a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b0,"CPACK_PACKAGE_CHECKSUM","");
      local_250 = GetOption(this,(string *)local_4b0);
      if (local_4b0 != (undefined1  [8])&local_4a0) {
        operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
      }
      pcVar10 = "";
      if (local_250 != (char *)0x0) {
        pcVar10 = local_250;
      }
      cmCryptoHash::New((cmCryptoHash *)local_4b8,pcVar10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b0,"Copying final package(s) [",0x1a);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]:",2);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var4._M_p = local_238[0]._M_dataplus._M_p;
      sVar9 = strlen(local_238[0]._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x427,_Var4._M_p,sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar11) {
        operator_delete(local_238[0]._M_dataplus._M_p,
                        CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                 local_238[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
      std::ios_base::~ios_base(local_440);
      filename_00 = (this->packageFileNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = (this->packageFileNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (filename_00 != local_b0) {
        local_b8 = _VTT;
        local_c0 = _vtable;
        do {
          local_4b0 = (undefined1  [8])&local_4a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4b0,"CPACK_OUTPUT_FILE_PREFIX","");
          pcVar10 = GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_4b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,pcVar10,(allocator<char> *)local_238);
          if (local_4b0 != (undefined1  [8])&local_4a0) {
            operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
          }
          cmsys::SystemTools::GetFilenameName(&local_290,filename_00);
          pcVar10 = (filename_00->_M_dataplus)._M_p;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0,"/",&local_290);
          std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_4b0);
          local_240 = filename_00;
          if (local_4b0 != (undefined1  [8])&local_4a0) {
            operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
          }
          _Var4._M_p = local_270._M_dataplus._M_p;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4b0,"Copy final package(s): ",0x17);
          if (pcVar10 == (char *)0x0) {
            pcVar10 = "(NULL)";
          }
          sVar9 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,pcVar10,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0," to ",4);
          pcVar13 = _Var4._M_p;
          if (_Var4._M_p == (char *)0x0) {
            pcVar13 = "(NULL)";
          }
          sVar9 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,pcVar13,sVar9);
          cVar3 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4b0;
          std::ios::widen((char)*(undefined8 *)((long)local_4b0 + -0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
          local_248 = _Var4._M_p;
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var4._M_p = local_238[0]._M_dataplus._M_p;
          sVar9 = strlen(local_238[0]._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x433,_Var4._M_p,sVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
            operator_delete(local_238[0]._M_dataplus._M_p,
                            CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                     local_238[0].field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
          std::ios_base::~ios_base(local_440);
          bVar6 = cmsys::SystemTools::CopyFileIfDifferent(local_240,&local_270);
          if (!bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4b0,"Problem copying the package: ",0x1d);
            sVar9 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,pcVar10,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0," to ",4);
            sVar9 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,pcVar13,sVar9);
            std::endl<char,std::char_traits<char>>((ostream *)local_4b0);
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var4._M_p = local_238[0]._M_dataplus._M_p;
            sVar9 = strlen(local_238[0]._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x439,_Var4._M_p,sVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
              operator_delete(local_238[0]._M_dataplus._M_p,
                              CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                       local_238[0].field_2._M_local_buf[0]) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
            std::ios_base::~ios_base(local_440);
LAB_00152f93:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1
                             );
            }
            iVar7 = 0;
            goto LAB_00152fdf;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"- package: ",0xb)
          ;
          pcVar10 = local_248;
          if (local_248 == (char *)0x0) {
            std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_4b0 + -0x18) + 0x38)
            ;
          }
          else {
            sVar9 = strlen(local_248);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,pcVar10,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0," generated.",0xb)
          ;
          std::ios::widen((char)*(undefined8 *)((long)local_4b0 + -0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var4._M_p = local_238[0]._M_dataplus._M_p;
          sVar9 = strlen(local_238[0]._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x43e,_Var4._M_p,sVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
            operator_delete(local_238[0]._M_dataplus._M_p,
                            CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                     local_238[0].field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
          std::ios_base::~ios_base(local_440);
          if (local_4b8 != (undefined1  [8])0x0) {
            local_4b0 = (undefined1  [8])&local_4a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4b0,"CPACK_OUTPUT_FILE_PREFIX","");
            pcVar10 = GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_4b0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b0,pcVar10,(allocator<char> *)local_238);
            if (local_4b0 != (undefined1  [8])&local_4a0) {
              operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0,"/",&local_290);
            std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_4b0);
            if (local_4b0 != (undefined1  [8])&local_4a0) {
              operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4d8,local_250,&local_4d9);
            cmsys::SystemTools::LowerCase(local_238,&local_4d8);
            plVar12 = (long *)std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0x55704e)
            ;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 == paVar11) {
              local_4a0._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_4a0._8_8_ = plVar12[3];
              local_4b0 = (undefined1  [8])&local_4a0;
            }
            else {
              local_4a0._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_4b0 = (undefined1  [8])*plVar12;
            }
            local_4a8 = plVar12[1];
            *plVar12 = (long)paVar11;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_4b0);
            if (local_4b0 != (undefined1  [8])&local_4a0) {
              operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
              operator_delete(local_238[0]._M_dataplus._M_p,
                              CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                       local_238[0].field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1
                             );
            }
            std::ofstream::ofstream
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4b0,(char *)local_2b0,_S_out);
            this_02 = local_4b8;
            uVar1 = *(uint *)((long)auStack_490 + *(long *)((long)local_4b0 + -0x18));
            if ((uVar1 & 5) == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4d8,local_248,&local_4d9);
              cmCryptoHash::HashFile(local_238,(cmCryptoHash *)this_02,&local_4d8);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4b0,local_238[0]._M_dataplus._M_p,
                                  local_238[0]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_290._M_dataplus._M_p,local_290._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
                operator_delete(local_238[0]._M_dataplus._M_p,
                                CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                         local_238[0].field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                operator_delete(local_4d8._M_dataplus._M_p,
                                local_4d8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,"- checksum file: ",0x11);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_238,(char *)local_2b0,local_2a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," generated.",0xb);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              _Var4._M_p = local_4d8._M_dataplus._M_p;
              sVar9 = strlen(local_4d8._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x44f,_Var4._M_p,sVar9);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,"Cannot create checksum file: ",0x1d);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_238,(char *)local_2b0,local_2a8);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              _Var4._M_p = local_4d8._M_dataplus._M_p;
              sVar9 = strlen(local_4d8._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x449,_Var4._M_p,sVar9);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
            std::ios_base::~ios_base(local_1c8);
            local_4b0 = (undefined1  [8])local_b8;
            *(undefined8 *)(local_4b0 + (&local_b8->_M_allocated_capacity)[-3]) = local_c0;
            std::filebuf::~filebuf((filebuf *)&local_4a8);
            std::ios_base::~ios_base(local_3b8);
            if (local_2b0 != local_2a0) {
              operator_delete(local_2b0,local_2a0[0] + 1);
            }
            if ((uVar1 & 5) != 0) goto LAB_00152f93;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          psVar5 = local_240;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          filename_00 = psVar5 + 1;
        } while (filename_00 != local_b0);
      }
      iVar7 = 1;
LAB_00152fdf:
      std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)local_4b8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b0,"Cannot find any files in the packaging tree",0x2b);
    std::ios::widen((char)(ostream *)local_4b0 + (char)*(undefined8 *)((long)local_4b0 + -0x18));
    std::ostream::put((char)local_4b0);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var4._M_p = local_238[0]._M_dataplus._M_p;
    sVar9 = strlen(local_238[0]._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3ef,_Var4._M_p,sVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,
                      CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                               local_238[0].field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base(local_440);
    iVar7 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  cmsys::Glob::~Glob(&local_88);
  return iVar7;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if (!this->PrepareNames()) {
    return 0;
  }

  // Digest Component grouping specification
  if (!this->PrepareGroupingKind()) {
    return 0;
  }

  if (cmSystemTools::IsOn(
        this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY"))) {
    const char* toplevelDirectory =
      this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if (cmSystemTools::FileExists(toplevelDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: " << toplevelDirectory
                                                  << std::endl);
      if (!cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem removing toplevel directory: "
                        << toplevelDirectory << std::endl);
        return 0;
      }
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if (!this->InstallProject()) {
    return 0;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Done install project " << std::endl);

  const char* tempPackageFileName =
    this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  const char* tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = tempDirectory;
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the packaging tree" << std::endl);
    return 0;
  }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Package files to: "
                  << (tempPackageFileName ? tempPackageFileName : "(NULL)")
                  << std::endl);
  if (cmSystemTools::FileExists(tempPackageFileName)) {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Remove old package file" << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
  }
  if (cmSystemTools::IsOn(
        this->GetOption("CPACK_INCLUDE_TOPLEVEL_DIRECTORY"))) {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  }

  // The files to be installed
  files = gl.GetFiles();

  packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  packageFileNames.emplace_back(tempPackageFileName ? tempPackageFileName
                                                    : "");
  toplevel = tempDirectory;
  { // scope that enables package generators to run internal scripts with
    // latest CMake policies enabled
    cmMakefile::ScopePushPop pp{ this->MakefileMap };
    this->MakefileMap->SetPolicyVersion(cmVersion::GetCMakeVersion(),
                                        std::string());

    if (!this->PackageFiles() || cmSystemTools::GetErrorOccuredFlag()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem compressing the directory" << std::endl);
      return 0;
    }
  }

  /* Prepare checksum algorithm*/
  const char* algo = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  std::unique_ptr<cmCryptoHash> crypto = cmCryptoHash::New(algo ? algo : "");

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Copying final package(s) [" << packageFileNames.size()
                                             << "]:" << std::endl);
  /* now copy package one by one */
  for (std::string const& pkgFileName : packageFileNames) {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    std::string filename(cmSystemTools::GetFilenameName(pkgFileName));
    tempPackageFileName = pkgFileName.c_str();
    tmpPF += "/" + filename;
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Copy final package(s): "
                    << (tempPackageFileName ? tempPackageFileName : "(NULL)")
                    << " to " << (packageFileName ? packageFileName : "(NULL)")
                    << std::endl);
    if (!cmSystemTools::CopyFileIfDifferent(pkgFileName, tmpPF)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "Problem copying the package: "
          << (tempPackageFileName ? tempPackageFileName : "(NULL)") << " to "
          << (packageFileName ? packageFileName : "(NULL)") << std::endl);
      return 0;
    }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- package: " << packageFileName << " generated."
                                << std::endl);

    /* Generate checksum file */
    if (crypto) {
      std::string hashFile(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
      hashFile += "/" + filename;
      hashFile += "." + cmSystemTools::LowerCase(algo);
      cmsys::ofstream outF(hashFile.c_str());
      if (!outF) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot create checksum file: " << hashFile
                                                      << std::endl);
        return 0;
      }
      outF << crypto->HashFile(packageFileName) << "  " << filename << "\n";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- checksum file: " << hashFile << " generated."
                                        << std::endl);
    }
  }

  return 1;
}